

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::SegmentInfo::set_muxing_app(SegmentInfo *this,char *app)

{
  size_t __n;
  char *__dest;
  
  if (app != (char *)0x0) {
    __n = strlen(app);
    __dest = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    if (__dest != (char *)0x0) {
      memcpy(__dest,app,__n);
      __dest[__n] = '\0';
      if (this->muxing_app_ != (char *)0x0) {
        operator_delete__(this->muxing_app_);
      }
      this->muxing_app_ = __dest;
    }
  }
  return;
}

Assistant:

void SegmentInfo::set_muxing_app(const char* app) {
  if (app) {
    const size_t length = strlen(app) + 1;
    char* temp_str = new (std::nothrow) char[length];  // NOLINT
    if (!temp_str)
      return;

    memcpy(temp_str, app, length - 1);
    temp_str[length - 1] = '\0';

    delete[] muxing_app_;
    muxing_app_ = temp_str;
  }
}